

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall Js::InterpreterStackFrame::ProcessAsmJsModule(InterpreterStackFrame *this)

{
  WriteBarrierPtr<void> *pWVar1;
  WriteBarrierPtr<void> *addr;
  DisableImplicitFlags DVar2;
  ImplicitCallFlags IVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FunctionProxy *this_00;
  ScriptFunction *func;
  PropertyIdArray *propIds;
  code *pcVar9;
  bool bVar10;
  BOOL BVar11;
  uint uVar12;
  AsmJsModuleInfo *info;
  Recycler *pRVar13;
  undefined4 *puVar14;
  WriteBarrierPtr<void> *__s;
  Var pvVar15;
  ModuleVar *pMVar16;
  ModuleVarImport *pMVar17;
  RecyclableObject *pRVar18;
  ModuleFunctionImport *pMVar19;
  FrameDisplay *environment;
  ModuleFunction *pMVar20;
  FunctionInfoPtrPtr infoRef;
  AsmJsScriptFunction *function;
  Type *pTVar21;
  FunctionBody *this_01;
  void *pvVar22;
  ProxyEntryPointInfo *pPVar23;
  ModuleFunctionTable *pMVar24;
  undefined8 uVar25;
  JavascriptMethod p_Var26;
  ThreadContext *pTVar27;
  Type *literalType;
  PropertyRecord *pPVar28;
  int iVar29;
  size_t sVar30;
  char *addr_00;
  ScriptContext *pSVar31;
  char16_t *pcVar32;
  long lVar33;
  int iVar34;
  uint index;
  size_t __n;
  ulong uVar35;
  double dVar36;
  undefined1 local_b0 [8];
  TrackAllocData data;
  Var local_68;
  char *local_50;
  
  this_00 = *(FunctionProxy **)(this + 0x88);
  info = (AsmJsModuleInfo *)FunctionProxy::GetAuxPtr(this_00,AsmJsModuleInfo);
  if (DAT_0159ef9a == '\x01') {
    pSVar31 = *(ScriptContext **)(this + 0x78);
    pcVar32 = L"Asm.js Runtime Error : Forcing link failure";
LAB_00989c0a:
    AsmJSCompiler::OutputError(pSVar31,pcVar32);
    pvVar15 = ProcessLinkFailedAsmJsModule(this);
    return pvVar15;
  }
  if (*(int *)(this + 0x18) != info->mArgInCount + 1) {
    pSVar31 = *(ScriptContext **)(this + 0x78);
    pcVar32 = L"Asm.js Runtime Error : Invalid module argument count";
    goto LAB_00989c0a;
  }
  data.plusSize = (size_t)(info->mModuleMemory).mMemorySize;
  local_b0 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_4bc56d6;
  data.filename._0_4_ = 0xa68;
  data._32_8_ = this_00;
  pRVar13 = Memory::Recycler::TrackAllocInfo
                      (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),(TrackAllocData *)local_b0);
  iVar29 = (info->mModuleMemory).mMemorySize;
  if ((long)iVar29 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar13,(TrackAllocData *)0x0);
    __s = (WriteBarrierPtr<void> *)&DAT_00000008;
  }
  else {
    __n = (long)iVar29 << 3;
    sVar30 = 0xffffffffffffffff;
    if (-1 < iVar29) {
      sVar30 = __n;
    }
    BVar11 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar11 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                   ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                   "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar10) goto LAB_0098a9f5;
      *puVar14 = 0;
    }
    __s = (WriteBarrierPtr<void> *)
          Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                    (pRVar13,sVar30);
    if (__s == (WriteBarrierPtr<void> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                   ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar10) goto LAB_0098a9f5;
      *puVar14 = 0;
    }
    memset(__s,0,__n);
  }
  lVar33 = (long)(info->mModuleMemory).mArrayBufferOffset;
  if (lVar33 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0xa6a,
                                 "(moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset)"
                                 ,
                                 "moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset"
                                );
    if (!bVar10) {
LAB_0098a9f5:
      pcVar9 = (code *)invalidInstructionException();
      (*pcVar9)();
    }
    *puVar14 = 0;
  }
  pWVar1 = __s + (info->mModuleMemory).mStdLibOffset;
  if (*(int *)(this + 0x18) < 2) {
    pvVar22 = (void *)0x0;
  }
  else {
    pvVar22 = *(void **)(*(long *)(this + 0x20) + 8);
  }
  iVar29 = (info->mModuleMemory).mIntOffset;
  iVar4 = (info->mModuleMemory).mFloatOffset;
  iVar5 = (info->mModuleMemory).mDoubleOffset;
  iVar6 = (info->mModuleMemory).mFFIOffset;
  iVar7 = (info->mModuleMemory).mFuncOffset;
  iVar8 = (info->mModuleMemory).mFuncPtrOffset;
  addr = __s + lVar33;
  lVar33 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  Memory::Recycler::WBSetBit((char *)pWVar1);
  pWVar1->ptr = pvVar22;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar1);
  if (*(int *)(this + 0x18) < 3) {
    local_68 = (Var)0x0;
  }
  else {
    local_68 = *(Var *)(*(long *)(this + 0x20) + 0x10);
    if (*(int *)(this + 0x18) != 3) {
      pvVar22 = *(void **)(*(long *)(this + 0x20) + 0x18);
      goto LAB_00989d55;
    }
  }
  pvVar22 = (void *)0x0;
LAB_00989d55:
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pvVar22;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  DVar2 = *(DisableImplicitFlags *)(lVar33 + 0x1542);
  IVar3 = *(ImplicitCallFlags *)(lVar33 + 0x1570);
  *(DisableImplicitFlags *)(lVar33 + 0x1542) = DVar2 | DisableImplicitCallFlag;
  *(undefined1 *)(lVar33 + 0x1570) = 1;
  bVar10 = ASMLink::CheckParams
                     (*(ScriptContext **)(this + 0x78),info,pWVar1->ptr,local_68,addr->ptr);
  if (bVar10) {
    pSVar31 = *(ScriptContext **)(this + 0x78);
    pTVar27 = pSVar31->threadContext;
    if (pTVar27->implicitCallFlags < 2) {
      if (0 < info->mVarCount) {
        iVar34 = 0;
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          pMVar16 = AsmJsModuleInfo::GetVar(info,iVar34);
          AsmJsVarType::AsmJsVarType((AsmJsVarType *)local_b0,pMVar16->type);
          if (local_b0[0] == Float) {
            *(Type *)((long)&__s[iVar4].ptr + (ulong)pMVar16->location * 4) =
                 (pMVar16->initialiser).intInit;
          }
          else if (local_b0[0] == Double) {
            *(Type *)(__s + (long)iVar5 + (ulong)pMVar16->location) = pMVar16->initialiser;
          }
          else if (local_b0[0] == Int) {
            *(Type *)((long)&__s[iVar29].ptr + (ulong)pMVar16->location * 4) =
                 (pMVar16->initialiser).intInit;
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar14 = 1;
            bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                         ,0xa9c,"((0))","UNREACHED");
            if (!bVar10) goto LAB_0098a9f5;
            *puVar14 = 0;
          }
          iVar34 = iVar34 + 1;
        } while (iVar34 < info->mVarCount);
      }
      if (0 < info->mVarImportCount) {
        iVar34 = 0;
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          pMVar17 = AsmJsModuleInfo::GetVarImport(info,iVar34);
          AsmJsVarType::AsmJsVarType((AsmJsVarType *)local_b0,pMVar17->type);
          pvVar15 = JavascriptOperators::OP_GetProperty
                              (local_68,pMVar17->field,*(ScriptContext **)(this + 0x78));
          pSVar31 = *(ScriptContext **)(this + 0x78);
          pTVar27 = pSVar31->threadContext;
          if (ImplicitCall_None < pTVar27->implicitCallFlags) {
LAB_0098a82e:
            pTVar27->disableImplicitFlags = DVar2;
            pTVar27->implicitCallFlags = IVar3;
            pPVar28 = ScriptContext::GetPropertyName(pSVar31,pMVar17->field);
            pcVar32 = L"Asm.js Runtime Error : Accessing var import %s has side effects";
            goto LAB_0098a95e;
          }
          if ((DAT_015932da == '\x01') && (bVar10 = VarIs<Js::RecyclableObject>(pvVar15), bVar10)) {
            bVar10 = VarIs<Js::RecyclableObject>(pvVar15);
            if (bVar10) {
              pRVar18 = VarTo<Js::RecyclableObject>(pvVar15);
              bVar10 = DynamicType::Is(((pRVar18->type).ptr)->typeId);
              if (!bVar10) goto LAB_00989fc2;
            }
            pSVar31 = *(ScriptContext **)(this + 0x78);
            pPVar28 = ScriptContext::GetPropertyName(pSVar31,pMVar17->field);
            pcVar32 = L"Asm.js Runtime Error : Var import %s must be primitive";
            goto LAB_0098a9af;
          }
LAB_00989fc2:
          if (local_b0[0] == Float) {
            if (((ulong)pvVar15 & 0x1ffff00000000) == 0x1000000000000 ||
                ((ulong)pvVar15 & 0xffff000000000000) != 0x1000000000000) {
              if (((ulong)pvVar15 & 0xffff000000000000) == 0x1000000000000) goto LAB_0098a18e;
              if (pvVar15 < (Var)0x4000000000000) {
                dVar36 = JavascriptConversion::ToNumber_Full
                                   (pvVar15,*(ScriptContext **)(this + 0x78));
              }
              else {
                dVar36 = (double)((ulong)pvVar15 ^ 0xfffc000000000000);
              }
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar14 = 1;
              bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                           ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                           "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar10) goto LAB_0098a9f5;
              *puVar14 = 0;
LAB_0098a18e:
              dVar36 = (double)(int)pvVar15;
            }
            *(float *)((long)&__s[iVar4].ptr + (ulong)pMVar17->location * 4) = (float)dVar36;
          }
          else if (local_b0[0] == Double) {
            if (((ulong)pvVar15 & 0x1ffff00000000) == 0x1000000000000 ||
                ((ulong)pvVar15 & 0xffff000000000000) != 0x1000000000000) {
              if (((ulong)pvVar15 & 0xffff000000000000) == 0x1000000000000) goto LAB_0098a16b;
              if (pvVar15 < (Var)0x4000000000000) {
                pvVar22 = (void *)JavascriptConversion::ToNumber_Full
                                            (pvVar15,*(ScriptContext **)(this + 0x78));
              }
              else {
                pvVar22 = (void *)((ulong)pvVar15 ^ 0xfffc000000000000);
              }
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar14 = 1;
              bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                           ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                           "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar10) goto LAB_0098a9f5;
              *puVar14 = 0;
LAB_0098a16b:
              pvVar22 = (void *)(double)(int)pvVar15;
            }
            __s[(long)iVar5 + (ulong)pMVar17->location].ptr = pvVar22;
          }
          else if (local_b0[0] == Int) {
            if (((ulong)pvVar15 & 0x1ffff00000000) == 0x1000000000000 ||
                ((ulong)pvVar15 & 0xffff000000000000) != 0x1000000000000) {
              if (((ulong)pvVar15 & 0xffff000000000000) == 0x1000000000000) goto LAB_0098a1b5;
              uVar12 = JavascriptMath::ToInt32_Full(pvVar15,*(ScriptContext **)(this + 0x78));
              pvVar15 = (Var)(ulong)uVar12;
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar14 = 1;
              bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                           ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                           "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar10) goto LAB_0098a9f5;
              *puVar14 = 0;
LAB_0098a1b5:
              if (((ulong)pvVar15 & 0x1ffff00000000) != 0x1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar14 = 1;
                bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                             ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                             "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar10) goto LAB_0098a9f5;
                *puVar14 = 0;
              }
            }
            *(int *)((long)&__s[iVar29].ptr + (ulong)pMVar17->location * 4) = (int)pvVar15;
          }
          pSVar31 = *(ScriptContext **)(this + 0x78);
          pTVar27 = pSVar31->threadContext;
          if (ImplicitCall_None < pTVar27->implicitCallFlags) goto LAB_0098a82e;
          iVar34 = iVar34 + 1;
        } while (iVar34 < info->mVarImportCount);
      }
      if (0 < info->mFunctionImportCount) {
        iVar29 = 0;
        do {
          pMVar19 = AsmJsModuleInfo::GetFunctionImport(info,iVar29);
          pvVar15 = JavascriptOperators::OP_GetProperty
                              (local_68,pMVar19->field,*(ScriptContext **)(this + 0x78));
          pSVar31 = *(ScriptContext **)(this + 0x78);
          pTVar27 = pSVar31->threadContext;
          if (ImplicitCall_None < pTVar27->implicitCallFlags) {
            pTVar27->disableImplicitFlags = DVar2;
            pTVar27->implicitCallFlags = IVar3;
            pPVar28 = ScriptContext::GetPropertyName(pSVar31,pMVar19->field);
            pcVar32 = 
            L"Asm.js Runtime Error : Accessing foreign function import %s has side effects";
LAB_0098a95e:
            AsmJSCompiler::OutputError(pSVar31,pcVar32,pPVar28 + 1);
            goto LAB_0098a9d8;
          }
          bVar10 = VarIs<Js::JavascriptFunction>(pvVar15);
          if (!bVar10) {
            pSVar31 = *(ScriptContext **)(this + 0x78);
            pPVar28 = ScriptContext::GetPropertyName(pSVar31,pMVar19->field);
            pcVar32 = L"Asm.js Runtime Error : Foreign function import %s is not a function";
LAB_0098a9af:
            AsmJSCompiler::OutputError(pSVar31,pcVar32,pPVar28 + 1);
            goto LAB_0098a9c5;
          }
          pWVar1 = __s + (long)iVar6 + (ulong)pMVar19->location;
          Memory::Recycler::WBSetBit((char *)pWVar1);
          pWVar1->ptr = pvVar15;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar1);
          iVar29 = iVar29 + 1;
        } while (iVar29 < info->mFunctionImportCount);
      }
      *(DisableImplicitFlags *)(lVar33 + 0x1542) = DVar2;
      *(ImplicitCallFlags *)(lVar33 + 0x1570) = IVar3;
      local_b0 = (undefined1  [8])&FrameDisplay::typeinfo;
      data.typeinfo = (type_info *)&DAT_00000008;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_4bc56d6;
      data.filename._0_4_ = 0xae7;
      pRVar13 = Memory::Recycler::TrackAllocInfo
                          (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),
                           (TrackAllocData *)local_b0);
      index = 0;
      environment = (FrameDisplay *)new<Memory::Recycler>(8,pRVar13,0x751f50,0);
      environment->tag = true;
      environment->strictMode = false;
      environment->length = 0;
      environment->unused = 0;
      if (0 < info->mFunctionCount) {
        do {
          pMVar20 = AsmJsModuleInfo::GetFunction(info,index);
          infoRef = ParseableFunctionInfo::GetNestedFuncReference
                              (*(ParseableFunctionInfo **)(this + 0x88),index);
          function = AsmJsScriptFunction::OP_NewAsmJsFunc(environment,infoRef);
          pWVar1 = __s + (long)iVar7 + (ulong)pMVar20->location;
          Memory::Recycler::WBSetBit((char *)pWVar1);
          pWVar1->ptr = function;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar1);
          pTVar21 = (function->super_ScriptFunction).super_ScriptFunctionBase.
                    super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.type.ptr;
          if (pTVar21->entryPoint == JavascriptFunction::DeferredDeserializeThunk) {
            JavascriptFunction::DeferredDeserialize(&function->super_ScriptFunction);
            pTVar21 = (function->super_ScriptFunction).super_ScriptFunctionBase.
                      super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.type.ptr;
          }
          pTVar21->entryPoint = AsmJsExternalEntryPoint;
          this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
          pvVar22 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_01,AsmJsFunctionInfo);
          Memory::Recycler::WBSetBit((char *)((long)pvVar22 + 0xa8));
          *(undefined8 *)((long)pvVar22 + 0xa8) = data._32_8_;
          Memory::RecyclerWriteBarrierManager::WriteBarrier((char *)((long)pvVar22 + 0xa8));
          Memory::Recycler::WBSetBit((char *)&function->m_moduleEnvironment);
          (function->m_moduleEnvironment).ptr = __s;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&function->m_moduleEnvironment);
          if (info->mIsProcessed == false) {
            pPVar23 = ScriptFunction::GetEntryPointInfo(&function->super_ScriptFunction);
            *(byte *)&pPVar23[1].super_ExpirableObject.super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
                 *(byte *)&pPVar23[1].super_ExpirableObject.super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject | 8;
            bVar10 = Phases::IsEnabled((Phases *)&DAT_015aabd0,AsmJsJITTemplatePhase);
            if (!bVar10) {
              pPVar23->jsMethod = AsmJsDelayDynamicInterpreterThunk;
            }
          }
          index = index + 1;
        } while ((int)index < info->mFunctionCount);
      }
      if (0 < info->mFunctionTableCount) {
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        lVar33 = 0;
        do {
          pMVar24 = AsmJsModuleInfo::GetFunctionTable(info,(int)lVar33);
          data.plusSize = (size_t)pMVar24->size;
          local_b0 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_4bc56d6;
          data.filename._0_4_ = 0xb11;
          pRVar13 = Memory::Recycler::TrackAllocInfo
                              (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),
                               (TrackAllocData *)local_b0);
          uVar12 = pMVar24->size;
          if ((ulong)uVar12 == 0) {
            Memory::Recycler::ClearTrackAllocInfo(pRVar13,(TrackAllocData *)0x0);
            local_50 = &DAT_00000008;
          }
          else {
            BVar11 = ExceptionCheck::CanHandleOutOfMemory();
            if (BVar11 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar14 = 1;
              bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                           "ExceptionCheck::CanHandleOutOfMemory()");
              if (!bVar10) goto LAB_0098a9f5;
              *puVar14 = 0;
            }
            sVar30 = (ulong)uVar12 << 3;
            local_50 = Memory::Recycler::
                       AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>(pRVar13,sVar30)
            ;
            if (local_50 == (char *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar14 = 1;
              bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
              if (!bVar10) goto LAB_0098a9f5;
              *puVar14 = 0;
            }
            memset(local_50,0,sVar30);
          }
          if (pMVar24->size != 0) {
            uVar35 = 0;
            addr_00 = local_50;
            do {
              pvVar22 = __s[(long)iVar7 + (ulong)(pMVar24->moduleFunctionIndex).ptr[uVar35]].ptr;
              Memory::Recycler::WBSetBit(addr_00);
              *(void **)addr_00 = pvVar22;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
              uVar35 = uVar35 + 1;
              addr_00 = addr_00 + 8;
            } while (uVar35 < pMVar24->size);
          }
          pWVar1 = __s + iVar8 + lVar33;
          Memory::Recycler::WBSetBit((char *)pWVar1);
          pWVar1->ptr = local_50;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar1);
          lVar33 = lVar33 + 1;
        } while (lVar33 < info->mFunctionTableCount);
      }
      bVar10 = Phases::IsEnabled((Phases *)&DAT_015aabd0,AsmJsJITTemplatePhase);
      if (((bVar10) && (DAT_015a4e00 == 0)) ||
         ((bVar10 = Phases::IsEnabled((Phases *)&DAT_015aabd0,AsmJsJITTemplatePhase), !bVar10 &&
          ((DAT_015a4e08 == 0 || (DAT_0159efaa == '\x01')))))) {
        bVar10 = Phases::IsEnabled((Phases *)&DAT_015b6718,AsmjsEntryPointInfoPhase);
        if (bVar10) {
          uVar25 = (**(code **)(*(long *)data._32_8_ + 0x38))();
          Output::Print(L"%s Scheduling For Full JIT at callcount:%d\n",uVar25,0);
          Output::Flush();
        }
        if (0 < info->mFunctionCount) {
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          lVar33 = 0;
          do {
            func = (ScriptFunction *)__s[iVar7 + lVar33].ptr;
            if (func == (ScriptFunction *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar14 = 1;
              bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                           ,0xb2b,"(functionObj != nullptr)",
                                           "functionObj != nullptr");
              if (!bVar10) goto LAB_0098a9f5;
              *puVar14 = 0;
            }
            p_Var26 = RecyclableObject::GetEntryPoint((RecyclableObject *)func);
            if (p_Var26 == AsmJsExternalEntryPoint) {
              WAsmJs::JitFunctionIfReady(func,0);
            }
            lVar33 = lVar33 + 1;
          } while (lVar33 < info->mFunctionCount);
        }
      }
      info->mIsProcessed = true;
      if (info->mExportsCount == 0) {
        pvVar22 = __s[(long)iVar7 + (ulong)info->mExportFunctionIndex].ptr;
      }
      else {
        propIds = (info->mExports).ptr;
        pSVar31 = *(ScriptContext **)(this + 0x78);
        literalType = FunctionBody::GetObjectLiteralTypeRef(*(FunctionBody **)(this + 0x88),0);
        pvVar22 = JavascriptOperators::NewScObjectLiteral(pSVar31,propIds,literalType);
        if (0 < info->mExportsCount) {
          lVar33 = 0;
          do {
            JavascriptOperators::OP_InitProperty
                      (pvVar22,(&(info->mExports).ptr[1].count)[lVar33],
                       __s[(long)iVar7 + (ulong)(info->mExportsFunctionLocation).ptr[lVar33]].ptr);
            lVar33 = lVar33 + 1;
          } while (lVar33 < info->mExportsCount);
        }
      }
      ValidateRegValue(this,pvVar22,false,true);
    }
    pTVar27->disableImplicitFlags = DVar2;
    pTVar27->implicitCallFlags = IVar3;
    AsmJSCompiler::OutputError(pSVar31,L"Asm.js Runtime Error : Params have side effects");
  }
  else {
LAB_0098a9c5:
    *(DisableImplicitFlags *)(lVar33 + 0x1542) = DVar2;
    *(ImplicitCallFlags *)(lVar33 + 0x1570) = IVar3;
  }
LAB_0098a9d8:
  pvVar15 = ProcessLinkFailedAsmJsModule(this);
  return pvVar15;
}

Assistant:

Var InterpreterStackFrame::ProcessAsmJsModule()
    {
        FunctionBody* asmJsModuleFunctionBody = GetFunctionBody();
        AsmJsModuleInfo* info = asmJsModuleFunctionBody->GetAsmJsModuleInfo();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Configuration::Global.flags.ForceAsmJsLinkFail)
        {
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Forcing link failure"));
            return this->ProcessLinkFailedAsmJsModule();
        }
#endif
        if (m_inSlotsCount != info->GetArgInCount() + 1)
        {
            // Error reparse without asm.js
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Invalid module argument count"));
            return this->ProcessLinkFailedAsmJsModule();
        }

        const AsmJsModuleMemory& moduleMemory = info->GetModuleMemory();
        Field(Var)* moduleMemoryPtr = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), moduleMemory.mMemorySize);
        Field(Var)* arrayBufferPtr = moduleMemoryPtr + moduleMemory.mArrayBufferOffset;
        Assert(moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset);
        Field(Var)* stdLibPtr = moduleMemoryPtr + moduleMemory.mStdLibOffset;
        int* localIntSlots = (int*)(moduleMemoryPtr + moduleMemory.mIntOffset);
        float* localFloatSlots = (float*)(moduleMemoryPtr + moduleMemory.mFloatOffset);
        double* localDoubleSlots = (double*)(moduleMemoryPtr + moduleMemory.mDoubleOffset);
        Field(Var)* localFunctionImports = moduleMemoryPtr + moduleMemory.mFFIOffset;
        Field(Var)* localModuleFunctions = moduleMemoryPtr + moduleMemory.mFuncOffset;
        Field(Field(Var)*)* localFunctionTables = (Field(Field(Var)*)*)(moduleMemoryPtr + moduleMemory.mFuncPtrOffset);

        ThreadContext* threadContext = this->scriptContext->GetThreadContext();
        *stdLibPtr = (m_inSlotsCount > 1) ? m_inParams[1] : nullptr;

        Var foreign = (m_inSlotsCount > 2) ? m_inParams[2] : nullptr;
        *arrayBufferPtr = (m_inSlotsCount > 3) ? m_inParams[3] : nullptr;
        //cache the current state of the disable implicit call flag
        DisableImplicitFlags prevDisableImplicitFlags = threadContext->GetDisableImplicitFlags();
        ImplicitCallFlags saveImplicitcallFlags = threadContext->GetImplicitCallFlags();
        // Disable implicit calls to check if any of the VarImport or Function Import leads to implicit calls
        threadContext->DisableImplicitCall();
        threadContext->SetImplicitCallFlags(ImplicitCallFlags::ImplicitCall_None);
        bool checkParamResult = ASMLink::CheckParams(this->scriptContext, info, *stdLibPtr, foreign, *arrayBufferPtr);
        if (!checkParamResult)
        {
            // don't need to print, because checkParams will do it for us
            goto linkFailure;
        }
        else if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
        {
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Params have side effects"));
            return this->ProcessLinkFailedAsmJsModule();
        }
        // Initialize Variables
        for (int i = 0; i < info->GetVarCount(); i++)
        {
            const auto& var = info->GetVar(i);
            const AsmJsVarType type(var.type);
            if (type.isInt())
            {
                localIntSlots[var.location] = var.initialiser.intInit;
            }
            else if (type.isFloat())
            {
                localFloatSlots[var.location] = var.initialiser.floatInit;
            }
            else if (type.isDouble())
            {
                localDoubleSlots[var.location] = var.initialiser.doubleInit;
            }
            else
            {
                Assert(UNREACHED);
            }
        }

        // Load constant variables
        for (int i = 0; i < info->GetVarImportCount(); i++)
        {
            const auto& import = info->GetVarImport(i);
            const AsmJsVarType type(import.type);
            // this might throw, but it would anyway in non-asm.js
            Var value = JavascriptOperators::OP_GetProperty(foreign, import.field, scriptContext);
            // check if there is implicit call and if there is implicit call then clear the disableimplicitcall flag
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing var import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
            if (CONFIG_FLAG(AsmJsEdge))
            {
                // emscripten had a bug which caused this check to fail in some circumstances, so this check fails for some demos
                if (!TaggedNumber::Is(value) && (!VarIs<RecyclableObject>(value) || DynamicType::Is(VarTo<RecyclableObject>(value)->GetTypeId())))
                {
                    AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Var import %s must be primitive"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                    goto linkFailure;
                }
            }

            if (type.isInt())
            {
                int val = JavascriptMath::ToInt32(value, scriptContext);
                localIntSlots[import.location] = val;
            }
            else if (type.isFloat())
            {
                float val = (float)JavascriptConversion::ToNumber(value, scriptContext);
                localFloatSlots[import.location] = val;
            }
            else if (type.isDouble())
            {
                double val = JavascriptConversion::ToNumber(value, scriptContext);
                localDoubleSlots[import.location] = val;
            }

            // check for implicit call after converting to number
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                // Runtime error
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing var import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
        }
        // Load external functions
        for (int i = 0; i < info->GetFunctionImportCount(); i++)
        {
            const auto& import = info->GetFunctionImport(i);
            // this might throw, but it would anyway in non-asm.js
            Var importFunc = JavascriptOperators::OP_GetProperty(foreign, import.field, scriptContext);
            // check if there is implicit call and if there is implicit call then clear the disableimplicitcall flag
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing foreign function import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
            if (!VarIs<JavascriptFunction>(importFunc))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Foreign function import %s is not a function"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                goto linkFailure;
            }
            localFunctionImports[import.location] = importFunc;
        }

        threadContext->SetDisableImplicitFlags(prevDisableImplicitFlags);
        threadContext->SetImplicitCallFlags(saveImplicitcallFlags);
        // scope
        {
            FrameDisplay* pDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), sizeof(void*), FrameDisplay, 0);
            //DynamicObject* asmModule = scriptContext->GetLibrary()->CreateObject(false, 1);
            //JavascriptOperators::OP_SetProperty(asmModule, PropertyIds::module, moduleMemoryPtr, scriptContext);
            //pDisplay->SetItem(0, this->function);
            for (int i = 0; i < info->GetFunctionCount(); i++)
            {
                const auto& modFunc = info->GetFunction(i);

                // TODO: add more runtime checks here
                FunctionInfoPtrPtr functionInfo = m_functionBody->GetNestedFuncReference(i);

                AsmJsScriptFunction* scriptFuncObj = AsmJsScriptFunction::OP_NewAsmJsFunc(pDisplay, functionInfo);
                localModuleFunctions[modFunc.location] = scriptFuncObj;

                if (scriptFuncObj->GetDynamicType()->GetEntryPoint() == DefaultDeferredDeserializeThunk)
                {
                    JavascriptFunction::DeferredDeserialize(scriptFuncObj);
                }

                scriptFuncObj->GetDynamicType()->SetEntryPoint(AsmJsExternalEntryPoint);
                scriptFuncObj->GetFunctionBody()->GetAsmJsFunctionInfo()->SetModuleFunctionBody(asmJsModuleFunctionBody);
                scriptFuncObj->SetModuleEnvironment(moduleMemoryPtr);
                if (!info->IsRuntimeProcessed())
                {
                    // don't reset entrypoint upon relinking
                    FunctionEntryPointInfo* entrypointInfo = (FunctionEntryPointInfo*)scriptFuncObj->GetEntryPointInfo();
                    entrypointInfo->SetIsAsmJSFunction(true);

#if DYNAMIC_INTERPRETER_THUNK
                    if (!PHASE_ON1(AsmJsJITTemplatePhase))
                    {
                        entrypointInfo->jsMethod = AsmJsDefaultEntryThunk;
                    }
#endif
                }
            }
        }

        // Initialize function table arrays
        for (int i = 0; i < info->GetFunctionTableCount(); i++)
        {
            const auto& modFuncTable = info->GetFunctionTable(i);
            Field(Var)* funcTableArray = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), modFuncTable.size);
            for (uint j = 0; j < modFuncTable.size; j++)
            {
                // get the module function index
                const RegSlot index = modFuncTable.moduleFunctionIndex[j];
                // assign the module function pointer to the array
                Var functionPtr = localModuleFunctions[index];
                funcTableArray[j] = functionPtr;
            }
            localFunctionTables[i] = funcTableArray;
        }
        // Do MTJRC/MAIC:0 check
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (
            (PHASE_ON1(Js::AsmJsJITTemplatePhase) && CONFIG_FLAG(MaxTemplatizedJitRunCount) == 0) ||
            (!PHASE_ON1(Js::AsmJsJITTemplatePhase) && (CONFIG_FLAG(MaxAsmJsInterpreterRunCount) == 0 || CONFIG_FLAG(ForceNative)))
            )
        {
            if (PHASE_TRACE1(AsmjsEntryPointInfoPhase))
            {
                Output::Print(_u("%s Scheduling For Full JIT at callcount:%d\n"), asmJsModuleFunctionBody->GetDisplayName(), 0);
                Output::Flush();
            }
            for (int i = 0; i < info->GetFunctionCount(); i++)
            {
                ScriptFunction* functionObj = (ScriptFunction*)PointerValue(localModuleFunctions[i]);
                AnalysisAssert(functionObj != nullptr);
                // don't want to generate code for APIs like changeHeap
                if (functionObj->GetEntryPoint() == Js::AsmJsExternalEntryPoint)
                {
                    WAsmJs::JitFunctionIfReady(functionObj);
                }
            }
        }
#endif

        info->SetIsRuntimeProcessed(true);

        // create export object
        if (info->GetExportsCount())
        {
            Var newObj = JavascriptOperators::NewScObjectLiteral(GetScriptContext(), info->GetExportsIdArray(),
                this->GetFunctionBody()->GetObjectLiteralTypeRef(0));
            for (int i = 0; i < info->GetExportsCount(); i++)
            {
                auto ex = info->GetExport(i);
                Var func = localModuleFunctions[*ex.location];
                JavascriptOperators::OP_InitProperty(newObj, *ex.id, func);
            }
            SetReg((RegSlot)0, newObj);
            return newObj;
        }


        // export only 1 function
        {
            Var exportFunc = localModuleFunctions[info->GetExportFunctionIndex()];
            SetReg((RegSlot)0, exportFunc);
            return exportFunc;
        }

    linkFailure:
        threadContext->SetDisableImplicitFlags(prevDisableImplicitFlags);
        threadContext->SetImplicitCallFlags(saveImplicitcallFlags);
        return this->ProcessLinkFailedAsmJsModule();
    }